

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Node * expr_stmt(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  _Bool _Var1;
  C_Parser *pCVar2;
  C_Node *pCVar3;
  C_Token *pCVar4;
  C_Node *node;
  C_Token *tok_local;
  C_Token **rest_local;
  C_Parser *parser_local;
  
  node = (C_Node *)tok;
  tok_local = (C_Token *)rest;
  rest_local = (C_Token **)parser;
  _Var1 = C_equal(tok,";");
  if (_Var1) {
    *(C_Node **)tok_local = node->next;
    parser_local = (C_Parser *)new_node((C_Parser *)rest_local,ND_BLOCK,(C_Token *)node);
  }
  else {
    pCVar2 = (C_Parser *)new_node((C_Parser *)rest_local,ND_EXPR_STMT,(C_Token *)node);
    pCVar3 = expr((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node);
    pCVar2->locals = (C_Obj *)pCVar3;
    pCVar4 = C_skip((C_Parser *)rest_local,(C_Token *)node,";");
    *(C_Token **)tok_local = pCVar4;
    parser_local = pCVar2;
  }
  return (C_Node *)parser_local;
}

Assistant:

static C_Node *expr_stmt(C_Parser *parser, C_Token **rest, C_Token *tok) {
  if (C_equal(tok, ";")) {
    *rest = tok->next;
    return new_node(parser, ND_BLOCK, tok);
  }

  C_Node *node = new_node(parser, ND_EXPR_STMT, tok);
  node->lhs = expr(parser, &tok, tok);
  *rest = C_skip(parser, tok, ";");
  return node;
}